

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> * __thiscall
cmGeneratorTarget::GetLinkImplementationClosure(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  cmLinkImplementationLibraries *this_00;
  reference item;
  cmGlobalGenerator *gg;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_78;
  __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
  local_70;
  const_iterator it;
  cmLinkImplementationLibraries *impl;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  emitted;
  LinkImplClosure *tgts;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkImplClosure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::LinkImplClosure>_>_>
               ::operator[](&this->LinkImplClosureMap,config);
  if ((((mapped_type *)emitted._M_t._M_impl.super__Rb_tree_header._M_node_count)->Done & 1U) == 0) {
    ((mapped_type *)emitted._M_t._M_impl.super__Rb_tree_header._M_node_count)->Done = true;
    std::
    set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
           *)&impl);
    this_00 = GetLinkImplementationLibraries(this,config);
    local_70._M_current =
         (cmLinkImplItem *)
         std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin(&this_00->Libraries);
    while( true ) {
      local_78._M_current =
           (cmLinkImplItem *)
           std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end(&this_00->Libraries);
      bVar1 = __gnu_cxx::operator!=(&local_70,&local_78);
      if (!bVar1) break;
      item = __gnu_cxx::
             __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
             ::operator*(&local_70);
      gg = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
      processILibs(config,this,&item->super_cmLinkItem,gg,
                   (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
                   emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    *)&impl);
      __gnu_cxx::
      __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
      ::operator++(&local_70);
    }
    std::
    set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
    ::~set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            *)&impl);
  }
  return (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
         emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
}

Assistant:

const std::vector<const cmGeneratorTarget*>&
cmGeneratorTarget::GetLinkImplementationClosure(
    const std::string& config) const
{
  LinkImplClosure& tgts =
    this->LinkImplClosureMap[config];
  if(!tgts.Done)
    {
    tgts.Done = true;
    std::set<cmGeneratorTarget const*> emitted;

    cmLinkImplementationLibraries const* impl
      = this->GetLinkImplementationLibraries(config);

    for(std::vector<cmLinkImplItem>::const_iterator
          it = impl->Libraries.begin();
        it != impl->Libraries.end(); ++it)
      {
      processILibs(config, this, *it,
                   this->LocalGenerator->GetGlobalGenerator(),
                   tgts , emitted);
      }
    }
  return tgts;
}